

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RunPool.h
# Opt level: O0

void __thiscall RunPool<int>::Add(RunPool<int> *this,int *value)

{
  RunBlock<int> *pRVar1;
  RunBlock<int> *temp;
  int *value_local;
  RunPool<int> *this_local;
  
  if ((uint)this->end_back_->next_free_pos_ < 800) {
    this->end_back_->values[this->end_back_->next_free_pos_] = *value;
  }
  else {
    pRVar1 = Alloc();
    pRVar1->values[0] = *value;
    pRVar1->prev = this->end_back_;
    this->end_back_->next = pRVar1;
    this->end_back_ = pRVar1;
    this->end_block_ = pRVar1;
    this->size_ = this->size_ + 800;
  }
  this->end_back_->next_free_pos_ = this->end_back_->next_free_pos_ + 1;
  return;
}

Assistant:

void Add(ValueType &value) {
        if(end_back_->next_free_pos_ < kValuesPerBlock) {
            end_back_->values[end_back_->next_free_pos_] = value;
        } else {
            RunBlock<ValueType>* temp = Alloc();
            temp->values[0] = value;
            temp->prev = end_back_;
            end_back_->next = temp;
            end_back_ = temp;
            end_block_ = temp;
            size_ += kValuesPerBlock;
        }
        end_back_->next_free_pos_++;
    }